

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(defV *data,vector<double,_std::allocator<double>_> *val)

{
  string_view val_00;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  long *plVar4;
  complex<double> *pcVar5;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this;
  reference this_00;
  NamedPoint *pNVar6;
  reference pvVar7;
  int __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  double dVar8;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  string_view in_stack_00000018;
  NamedPoint *point;
  complex<double> *cval_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range3;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *cvec;
  complex<double> cval;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  complex<double> local_38;
  __sv_type local_28;
  double local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *local_8;
  
  pcVar3 = (char *)0x0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pcVar3 = CLI::std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(local_8,pcVar3,__c);
  switch(pcVar3) {
  case (char *)0x0:
    std::
    get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b5656);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff20,(value_type_conflict3 *)in_stack_ffffffffffffff18);
    break;
  case (char *)0x1:
    plVar4 = std::
             get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b5682);
    local_18 = (double)*plVar4;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
               (value_type_conflict3 *)in_stack_ffffffffffffff08);
    break;
  case (char *)0x2:
  default:
    std::
    get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b56b6);
    local_28 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
    helicsGetVector(in_stack_00000018,in_stack_00000010);
    break;
  case (char *)0x3:
    pcVar5 = std::
             get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b56fd);
    local_38._M_value._0_8_ = *(undefined8 *)pcVar5->_M_value;
    local_38._M_value._8_8_ = *(undefined8 *)(pcVar5->_M_value + 8);
    std::complex<double>::real_abi_cxx11_(&local_38);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
               (value_type_conflict3 *)in_stack_ffffffffffffff08);
    dVar8 = std::complex<double>::imag_abi_cxx11_(&local_38);
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      std::complex<double>::imag_abi_cxx11_(&local_38);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
                 (value_type_conflict3 *)in_stack_ffffffffffffff08);
    }
    break;
  case (char *)0x4:
    std::
    get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b57aa);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case (char *)0x5:
    this = std::
           get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)0x2b57cc);
    CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)this);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x2b5808);
    local_60._M_current =
         (complex<double> *)
         CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                   (in_stack_ffffffffffffff08);
    CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
              (in_stack_ffffffffffffff08);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                             ((__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                               *)in_stack_ffffffffffffff10,
                              (__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                               *)in_stack_ffffffffffffff08), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                ::operator*(&local_60);
      dVar8 = std::complex<double>::imag_abi_cxx11_(this_00);
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        in_stack_ffffffffffffff10 = local_10;
        std::abs<double>((complex<double> *)local_10);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
                   (value_type_conflict3 *)in_stack_ffffffffffffff08);
      }
      else {
        std::complex<double>::real_abi_cxx11_(this_00);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
                   (value_type_conflict3 *)in_stack_ffffffffffffff08);
      }
      __gnu_cxx::
      __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
      ::operator++(&local_60);
    }
    break;
  case (char *)0x6:
    pNVar6 = std::
             get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b591b);
    uVar2 = std::isnan(pNVar6->value);
    if ((uVar2 & 1) == 0) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      dVar8 = pNVar6->value;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_10,0);
      *pvVar7 = dVar8;
    }
    else {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
      val_00._M_str = pcVar3;
      val_00._M_len = (size_t)in_stack_ffffffffffffff40;
      helicsGetVector(val_00);
      std::vector<double,_std::allocator<double>_>::operator=
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      CLI::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20);
    }
  }
  return;
}

Assistant:

void valueExtract(const defV& data, std::vector<double>& val)
{
    val.resize(0);
    switch (data.index()) {
        case double_loc:  // double
            val.push_back(std::get<double>(data));
            break;
        case int_loc:  // int64_t
            val.push_back(static_cast<double>(std::get<int64_t>(data)));
            break;
        case string_loc:  // string
        default:
            helicsGetVector(std::get<std::string>(data), val);
            break;
        case complex_loc:  // complex
        {
            const std::complex<double> cval = std::get<std::complex<double>>(data);
            val.push_back(cval.real());
            if (cval.imag() != 0.0) {
                val.push_back(cval.imag());
            }
        } break;
        case vector_loc:  // vector
            val = std::get<std::vector<double>>(data);
            break;
        case complex_vector_loc:  // complex
        {
            const auto& cvec = std::get<std::vector<std::complex<double>>>(data);
            val.reserve(cvec.size());
            val.clear();
            for (const auto& cval : cvec) {
                if (cval.imag() == 0.0) {
                    val.push_back(cval.real());
                } else {
                    val.push_back(std::abs(cval));
                }
            }
        } break;
        case named_point_loc:  // named point
        {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = helicsGetVector(point.name);
            } else {
                val.resize(1);
                val[0] = point.value;
            }
            break;
        }
    }
}